

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::ContainsUntypedPointer(ValidationState_t *this,uint32_t id)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  int32_t iVar4;
  uint id_00;
  Instruction *this_00;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  
  do {
    this_00 = FindDef(this,id);
    if (this_00 == (Instruction *)0x0) {
      return false;
    }
    iVar4 = spvOpcodeGeneratesType((uint)(this_00->inst_).opcode);
    if (iVar4 == 0) {
      return false;
    }
    uVar1 = (this_00->inst_).opcode;
    uVar5 = (ulong)uVar1;
    sVar7 = 1;
    if (uVar5 < 0x22) {
      if ((0x3b800000UL >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 0x20) {
          if ((0x240000000U >> (uVar5 & 0x3f) & 1) != 0) {
            uVar5 = 1;
            do {
              uVar6 = (long)(this_00->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4;
              bVar2 = uVar5 < uVar6;
              if (uVar6 <= uVar5) {
                return bVar2;
              }
              id_00 = Instruction::GetOperandAs<unsigned_int>(this_00,uVar5);
              bVar3 = ContainsUntypedPointer(this,id_00);
              uVar5 = (ulong)((int)uVar5 + 1);
            } while (!bVar3);
            return bVar2;
          }
          goto LAB_001d4d18;
        }
        bVar2 = IsForwardPointer(this,id);
        sVar7 = 2;
        if (bVar2) {
          return false;
        }
      }
    }
    else {
LAB_001d4d18:
      if (uVar1 != 0x14ee) {
        if (uVar1 != 0x1141) {
          return false;
        }
        return true;
      }
    }
    id = Instruction::GetOperandAs<unsigned_int>(this_00,sVar7);
  } while( true );
}

Assistant:

bool ValidationState_t::ContainsUntypedPointer(uint32_t id) const {
  const auto inst = FindDef(id);
  if (!inst) return false;
  if (!spvOpcodeGeneratesType(inst->opcode())) return false;
  if (inst->opcode() == spv::Op::OpTypeUntypedPointerKHR) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(1u));
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      return ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(2u));
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct: {
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsUntypedPointer(inst->GetOperandAs<uint32_t>(i)))
          return true;
      }
      return false;
    }
    default:
      return false;
  }

  return false;
}